

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

CustomLayerParams_CustomLayerParamValue * __thiscall
CoreML::Specification::CustomLayerParams_CustomLayerParamValue::New
          (CustomLayerParams_CustomLayerParamValue *this,Arena *arena)

{
  CustomLayerParams_CustomLayerParamValue *this_00;
  
  this_00 = (CustomLayerParams_CustomLayerParamValue *)operator_new(0x20);
  CustomLayerParams_CustomLayerParamValue(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::CustomLayerParams_CustomLayerParamValue>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

CustomLayerParams_CustomLayerParamValue* CustomLayerParams_CustomLayerParamValue::New(::google::protobuf::Arena* arena) const {
  CustomLayerParams_CustomLayerParamValue* n = new CustomLayerParams_CustomLayerParamValue;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}